

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_decals.cpp
# Opt level: O0

void __thiscall DBaseDecal::CalcFracPos(DBaseDecal *this,side_t *wall,double x,double y)

{
  line_t_conflict *plVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dy;
  double dx;
  vertex_t *v2;
  vertex_t *v1;
  line_t_conflict *line;
  double y_local;
  double x_local;
  side_t *wall_local;
  DBaseDecal *this_local;
  
  plVar1 = wall->linedef;
  if (plVar1->sidedef[0] == wall) {
    v2 = plVar1->v1;
    dx = (double)plVar1->v2;
  }
  else {
    v2 = plVar1->v2;
    dx = (double)plVar1->v1;
  }
  dVar2 = vertex_t::fX((vertex_t *)dx);
  dVar3 = vertex_t::fX(v2);
  dVar4 = vertex_t::fY((vertex_t *)dx);
  dVar5 = vertex_t::fY(v2);
  dVar4 = dVar4 - dVar5;
  if (ABS(dVar2 - dVar3) <= ABS(dVar4)) {
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      dVar2 = vertex_t::fY(v2);
      this->LeftDistance = (y - dVar2) / dVar4;
    }
    else {
      this->LeftDistance = 0.0;
    }
  }
  else {
    dVar5 = vertex_t::fX(v2);
    this->LeftDistance = (x - dVar5) / (dVar2 - dVar3);
  }
  return;
}

Assistant:

void DBaseDecal::CalcFracPos (side_t *wall, double x, double y)
{
	line_t *line = wall->linedef;
	vertex_t *v1, *v2;

	if (line->sidedef[0] == wall)
	{
		v1 = line->v1;
		v2 = line->v2;
	}
	else
	{
		v1 = line->v2;
		v2 = line->v1;
	}

	double dx = v2->fX() - v1->fX();
	double dy = v2->fY() - v1->fY();

	if (fabs(dx) > fabs(dy))
	{
		LeftDistance = (x - v1->fX()) / dx;
	}
	else if (dy != 0)
	{
		LeftDistance = (y - v1->fY()) / dy;
	}
	else
	{
		LeftDistance = 0;
	}
}